

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeDepthWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,PixelBufferAccess *depthBuffer)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool *pbVar5;
  ulong uVar6;
  float fVar7;
  
  pbVar5 = &this->m_sampleRegister[0].depthPassed;
  for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
    if ((((SampleData *)(pbVar5 + -2))->isAlive == true) && (*pbVar5 == true)) {
      uVar2 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      uVar3 = (long)uVar2 % (long)numSamplesPerFragment;
      iVar4 = (int)((long)uVar2 / (long)numSamplesPerFragment) + fragNdxOffset;
      fVar1 = inputFragments[iVar4].sampleDepths[uVar3 & 0xffffffff];
      fVar7 = 1.0;
      if (fVar1 <= 1.0) {
        fVar7 = fVar1;
      }
      tcu::PixelBufferAccess::setPixDepth
                (depthBuffer,(float)(~-(uint)(fVar1 < 0.0) & (uint)fVar7),(int)uVar3,
                 inputFragments[iVar4].pixelCoord.m_data[0],
                 inputFragments[iVar4].pixelCoord.m_data[1]);
    }
    pbVar5 = pbVar5 + 0x84;
  }
  return;
}

Assistant:

void FragmentProcessor::executeDepthWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::PixelBufferAccess& depthBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive && m_sampleRegister[regSampleNdx].depthPassed)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const float			clampedDepth	= de::clamp(frag.sampleDepths[fragSampleNdx], 0.0f, 1.0f);

			depthBuffer.setPixDepth(clampedDepth, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}